

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

void idx2::Reverse<idx2::subband*>(subband *Beg,subband *End)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  u64 uVar4;
  u64 uVar5;
  u64 uVar6;
  u64 uVar7;
  u64 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  subband *psVar12;
  undefined6 uStack_2e;
  undefined2 local_28;
  undefined6 uStack_26;
  undefined2 uStack_20;
  undefined6 uStack_1e;
  undefined2 uStack_18;
  undefined6 uStack_16;
  undefined2 uStack_10;
  
  for (; psVar12 = End + -1, Beg < psVar12; Beg = Beg + 1) {
    uVar1 = (Beg->Grid).super_extent.From;
    uVar2 = (Beg->Grid).super_extent.Dims;
    uVar3 = (Beg->Grid).Strd;
    uVar4 = (Beg->AccumGrid).super_extent.From;
    uVar5 = (Beg->AccumGrid).super_extent.Dims;
    uVar6 = (Beg->AccumGrid).Strd;
    local_28 = (undefined2)uVar5;
    uStack_26 = (undefined6)(uVar5 >> 0x10);
    uStack_20 = (undefined2)uVar6;
    uStack_1e = (undefined6)(uVar6 >> 0x10);
    uStack_18 = (undefined2)*(undefined8 *)&Beg->Level3;
    uStack_16 = (undefined6)((ulong)*(undefined8 *)&Beg->Level3 >> 0x10);
    uStack_10 = (undefined2)*(undefined8 *)((long)&(Beg->LowHigh3).field_0 + 2);
    uStack_2e = (undefined6)(uVar4 >> 0x10);
    uVar5 = (psVar12->Grid).super_extent.From;
    uVar6 = End[-1].Grid.super_extent.Dims;
    uVar7 = End[-1].Grid.Strd;
    uVar8 = End[-1].AccumGrid.super_extent.From;
    uVar9 = *(undefined8 *)((long)&End[-1].AccumGrid.super_extent.Dims + 2);
    uVar10 = *(undefined8 *)((long)&End[-1].AccumGrid.Strd + 2);
    uVar11 = *(undefined8 *)((long)&End[-1].Level3.field_0 + 2);
    *(undefined8 *)((long)&(Beg->AccumGrid).super_extent.From + 2) =
         *(undefined8 *)((long)&End[-1].AccumGrid.super_extent.From + 2);
    *(undefined8 *)((long)&(Beg->AccumGrid).super_extent.Dims + 2) = uVar9;
    *(undefined8 *)((long)&(Beg->AccumGrid).Strd + 2) = uVar10;
    *(undefined8 *)((long)&(Beg->Level3).field_0 + 2) = uVar11;
    (Beg->Grid).super_extent.From = uVar5;
    (Beg->Grid).super_extent.Dims = uVar6;
    (Beg->Grid).Strd = uVar7;
    (Beg->AccumGrid).super_extent.From = uVar8;
    (psVar12->Grid).super_extent.From = uVar1;
    End[-1].Grid.super_extent.Dims = uVar2;
    End[-1].Grid.Strd = uVar3;
    End[-1].AccumGrid.super_extent.From = uVar4;
    *(ulong *)((long)&End[-1].AccumGrid.super_extent.From + 2) = CONCAT26(local_28,uStack_2e);
    *(ulong *)((long)&End[-1].AccumGrid.super_extent.Dims + 2) = CONCAT26(uStack_20,uStack_26);
    *(ulong *)((long)&End[-1].AccumGrid.Strd + 2) = CONCAT26(uStack_18,uStack_1e);
    *(ulong *)((long)&End[-1].Level3.field_0 + 2) = CONCAT26(uStack_10,uStack_16);
    End = psVar12;
  }
  return;
}

Assistant:

void
Reverse(i Beg, i End)
{
  auto It1 = Beg;
  auto It2 = End - 1;
  while (It1 < It2)
  {
    Swap(It1, It2);
    ++It1;
    --It2;
  }
}